

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O2

void transproc(quadtype nextquad)

{
  char target [10];
  
  getlabel(nextquad.op1.opnd,target);
  fwrite("; call ",7,1,(FILE *)ofp);
  fprintlexeme(ofp,nextquad.op1.opnd);
  fputc(10,(FILE *)ofp);
  emitone(opccall,nextquad.op1.opnd);
  fputc(10,(FILE *)ofp);
  return;
}

Assistant:

void    transproc(struct quadtype nextquad)
{
    char    target[LABELSIZE];
    
    getlabel(nextquad.op1.opnd, target);
    fprintf(ofp, "; call ");
    fprintlexeme(ofp, nextquad.op1.opnd);
    fprintf(ofp, "\n");
    emitone(opccall, nextquad.op1.opnd);
    fprintf(ofp, "\n");
}